

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock-test.c
# Opt level: O2

void * stress_reader(void *arg)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 uStack_50;
  undefined1 auStack_48 [12];
  uint seed;
  timespec now;
  
  puVar9 = (undefined8 *)auStack_48;
  uStack_50 = 0x10144a;
  iVar4 = clock_gettime(1,(timespec *)&now);
  if (iVar4 != 0) goto LAB_001014eb;
  seed = (uint)now.tv_nsec;
  iVar4 = 0;
  do {
    if (*arg <= iVar4) {
      return (void *)0x0;
    }
    uStack_50 = 0x101474;
    iVar5 = rand_r(&seed);
    uStack_50 = 0x101483;
    usleep((iVar5 % 8) * 10 + 10);
    uStack_50 = 0x10148c;
    rwlock_lock_read(*(RWLock **)((long)arg + 8));
    lVar6 = 1;
    while (lVar6 != 1000) {
      lVar2 = lVar6 * 4;
      lVar1 = lVar6 * 4;
      lVar6 = lVar6 + 1;
      if (*(int *)(*(long *)((long)arg + 0x10) + lVar1) !=
          *(int *)(*(long *)((long)arg + 0x10) + -4 + lVar2) + 1) {
        pcVar7 = "stress_data->data[i] == stress_data->data[i - 1] + 1";
        puVar8 = &uStack_50;
        uStack_50 = 0x1f;
        do {
          uVar3 = *puVar8;
          puVar9 = puVar8 + 1;
          *puVar8 = 0x1014eb;
          microatf_fail_require
                    ("%s:%d: %s not met",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/rwlock-test.c"
                     ,uVar3,pcVar7);
LAB_001014eb:
          pcVar7 = "clock_gettime(CLOCK_MONOTONIC, &now) == 0";
          puVar8 = (undefined8 *)((long)puVar9 + -8);
          *(undefined8 *)((long)puVar9 + -8) = 0x16;
        } while( true );
      }
    }
    uStack_50 = 0x1014b9;
    rwlock_unlock_read(*(RWLock **)((long)arg + 8));
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static void *
stress_reader(void *arg)
{
	struct stress_data *stress_data = arg;
	struct timespec now;
	ATF_REQUIRE(clock_gettime(CLOCK_MONOTONIC, &now) == 0);
	unsigned int seed = (unsigned int)now.tv_nsec;

	for (int i = 0; i < stress_data->iterations; ++i) {
		usleep((useconds_t)(((rand_r(&seed) % 8) + 1) * 10));

		rwlock_lock_read(stress_data->lock);
		for (int i = 1; i < 1000; ++i) {
			ATF_REQUIRE(stress_data->data[i] ==
			    stress_data->data[i - 1] + 1);
		}
		rwlock_unlock_read(stress_data->lock);
	}

	return NULL;
}